

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

RPCHelpMan * getmemoryinfo(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff088;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff090;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0a0;
  RPCResults *in_stack_fffffffffffff0b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0c0;
  allocator<char> *in_stack_fffffffffffff0c8;
  iterator in_stack_fffffffffffff0d0;
  RPCArgOptions *in_stack_fffffffffffff0d8;
  string *in_stack_fffffffffffff0e0;
  undefined7 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ef;
  undefined4 in_stack_fffffffffffff0f0;
  Type in_stack_fffffffffffff0f4;
  string *in_stack_fffffffffffff0f8;
  undefined4 in_stack_fffffffffffff100;
  Type in_stack_fffffffffffff104;
  undefined4 in_stack_fffffffffffff108;
  Type in_stack_fffffffffffff10c;
  RPCResult *in_stack_fffffffffffff110;
  undefined1 *local_eb8;
  undefined1 *local_ea0;
  undefined1 *local_e88;
  undefined1 *local_e70;
  RPCExamples *examples;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_c60 [37];
  allocator<char> local_c3b;
  allocator<char> local_c3a;
  allocator<char> local_c39;
  pointer local_c38;
  pointer pRStack_c30;
  pointer local_c28;
  allocator<char> local_c1d;
  undefined1 local_c1c;
  undefined1 local_c1b [2];
  undefined1 local_c19 [31];
  allocator<char> local_bfa;
  allocator<char> local_bf9 [31];
  allocator<char> local_bda;
  allocator<char> local_bd9 [17];
  undefined8 local_bc8;
  allocator<char> local_bba;
  allocator<char> local_bb9;
  size_type local_bb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_bb0;
  allocator<char> local_b9a;
  allocator<char> local_b99;
  _Alloc_hider local_b98;
  size_type sStack_b90;
  undefined1 local_b88 [15];
  allocator<char> local_b79;
  pointer local_b78;
  pointer pbStack_b70;
  pointer local_b68;
  allocator<char> local_b5a;
  allocator<char> local_b59 [31];
  allocator<char> local_b3a;
  allocator<char> local_b39 [30];
  allocator<char> local_b1b;
  allocator<char> local_b1a;
  allocator<char> local_b19 [31];
  allocator<char> local_afa;
  allocator<char> local_af9 [31];
  undefined1 local_ada [738];
  undefined1 local_7f8 [816];
  undefined1 local_4c8 [64];
  undefined1 local_488 [136];
  undefined1 local_400 [96];
  undefined1 local_3a0 [136];
  RPCResults local_318 [5];
  undefined1 local_290 [40];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  fun = (RPCMethodImpl *)local_ada;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            ((UniValue *)in_stack_fffffffffffff0d0,(char (*) [6])in_stack_fffffffffffff0c8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff098,in_stack_fffffffffffff090);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_290[0] = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0a0);
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff088);
  local_250 = 0;
  local_24f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
                 in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff088);
  __l._M_len = (size_type)in_stack_fffffffffffff0d8;
  __l._M_array = in_stack_fffffffffffff0d0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0c8,__l,
             (allocator_type *)in_stack_fffffffffffff0c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_b78 = (pointer)0x0;
  pbStack_b70 = (pointer)0x0;
  local_b68 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_b98._M_p = (pointer)0x0;
  sStack_b90 = 0;
  local_b88._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_bb8 = 0;
  aStack_bb0._M_allocated_capacity = 0;
  aStack_bb0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_bd9[1] = (allocator<char>)0x0;
  local_bd9[2] = (allocator<char>)0x0;
  local_bd9[3] = (allocator<char>)0x0;
  local_bd9[4] = (allocator<char>)0x0;
  local_bd9[5] = (allocator<char>)0x0;
  local_bd9[6] = (allocator<char>)0x0;
  local_bd9[7] = (allocator<char>)0x0;
  local_bd9[8] = (allocator<char>)0x0;
  local_bd9[9] = (allocator<char>)0x0;
  local_bd9[10] = (allocator<char>)0x0;
  local_bd9[0xb] = (allocator<char>)0x0;
  local_bd9[0xc] = (allocator<char>)0x0;
  local_bd9[0xd] = (allocator<char>)0x0;
  local_bd9[0xe] = (allocator<char>)0x0;
  local_bd9[0xf] = (allocator<char>)0x0;
  local_bd9[0x10] = (allocator<char>)0x0;
  local_bc8._0_1_ = '\0';
  local_bc8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_bf9[1] = (allocator<char>)0x0;
  local_bf9[2] = (allocator<char>)0x0;
  local_bf9[3] = (allocator<char>)0x0;
  local_bf9[4] = (allocator<char>)0x0;
  local_bf9[5] = (allocator<char>)0x0;
  local_bf9[6] = (allocator<char>)0x0;
  local_bf9[7] = (allocator<char>)0x0;
  local_bf9[8] = (allocator<char>)0x0;
  local_bf9[9] = (allocator<char>)0x0;
  local_bf9[10] = (allocator<char>)0x0;
  local_bf9[0xb] = (allocator<char>)0x0;
  local_bf9[0xc] = (allocator<char>)0x0;
  local_bf9[0xd] = (allocator<char>)0x0;
  local_bf9[0xe] = (allocator<char>)0x0;
  local_bf9[0xf] = (allocator<char>)0x0;
  local_bf9[0x10] = (allocator<char>)0x0;
  local_bf9[0x11] = (allocator<char>)0x0;
  local_bf9[0x12] = (allocator<char>)0x0;
  local_bf9[0x13] = (allocator<char>)0x0;
  local_bf9[0x14] = (allocator<char>)0x0;
  local_bf9[0x15] = (allocator<char>)0x0;
  local_bf9[0x16] = (allocator<char>)0x0;
  local_bf9[0x17] = (allocator<char>)0x0;
  local_bf9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_c19._1_8_ = 0;
  local_c19._9_8_ = 0;
  local_c19._17_8_ = 0;
  this_00 = (RPCHelpMan *)(local_c19 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  name = (string *)local_c19;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff088);
  __l_00._M_len = (size_type)in_stack_fffffffffffff0d8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff0d0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0c8,__l_00,
             (allocator_type *)in_stack_fffffffffffff0c0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
             (string *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
             in_stack_fffffffffffff0f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (bool)in_stack_fffffffffffff0ef);
  description = (string *)(local_c1b + 1);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff088);
  __l_01._M_len = (size_type)in_stack_fffffffffffff0d8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff0d0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0c8,__l_01,
             (allocator_type *)in_stack_fffffffffffff0c0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,
             (string *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108),
             in_stack_fffffffffffff104,in_stack_fffffffffffff0f8,
             (string *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
  results_00 = local_318;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_c1b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  examples = (RPCExamples *)&local_c1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  local_c38 = (pointer)0x0;
  pRStack_c30 = (pointer)0x0;
  local_c28 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff088);
  RPCResult::RPCResult
            (in_stack_fffffffffffff110,
             (string *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108),
             in_stack_fffffffffffff104,in_stack_fffffffffffff0f8,
             (string *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
  results._M_len = (size_type)in_stack_fffffffffffff0d8;
  results._M_array = (iterator)in_stack_fffffffffffff0d0;
  RPCResults::RPCResults(in_stack_fffffffffffff0b0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  HelpExampleCli(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0d8,(char *)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  HelpExampleRpc(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  std::operator+(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff088,(string *)0x137a078);
  this = (RPCArg *)local_c60;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getmemoryinfo()::__0,void>
            (in_stack_fffffffffffff098,(anon_class_1_0_00000001 *)in_stack_fffffffffffff090);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results_00,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_c60 + 0x24));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c3b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c39);
  RPCResults::~RPCResults((RPCResults *)this);
  local_e70 = local_290;
  do {
    local_e70 = local_e70 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_e70 != local_3a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c1d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_c1b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_e88 = local_400;
  do {
    local_e88 = local_e88 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_e88 != local_488);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_ea0 = local_4c8;
  do {
    local_ea0 = local_ea0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_ea0 != local_7f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bfa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_bf9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_bd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b88 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff098);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b39);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b1b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b19);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff098);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_eb8 = local_48;
  do {
    local_eb8 = local_eb8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_eb8 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_afa);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_af9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_ada);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ada + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmemoryinfo()
{
    /* Please, avoid using the word "pool" here in the RPC interface or help,
     * as users will undoubtedly confuse it with the other "memory pool"
     */
    return RPCHelpMan{"getmemoryinfo",
                "Returns an object containing information about memory usage.\n",
                {
                    {"mode", RPCArg::Type::STR, RPCArg::Default{"stats"}, "determines what kind of information is returned.\n"
            "  - \"stats\" returns general statistics about memory usage in the daemon.\n"
            "  - \"mallocinfo\" returns an XML string describing low-level heap state (only available if compiled with glibc)."},
                },
                {
                    RPCResult{"mode \"stats\"",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::OBJ, "locked", "Information about locked memory manager",
                            {
                                {RPCResult::Type::NUM, "used", "Number of bytes used"},
                                {RPCResult::Type::NUM, "free", "Number of bytes available in current arenas"},
                                {RPCResult::Type::NUM, "total", "Total number of bytes managed"},
                                {RPCResult::Type::NUM, "locked", "Amount of bytes that succeeded locking. If this number is smaller than total, locking pages failed at some point and key data could be swapped to disk."},
                                {RPCResult::Type::NUM, "chunks_used", "Number allocated chunks"},
                                {RPCResult::Type::NUM, "chunks_free", "Number unused chunks"},
                            }},
                        }
                    },
                    RPCResult{"mode \"mallocinfo\"",
                        RPCResult::Type::STR, "", "\"<malloc version=\"1\">...\""
                    },
                },
                RPCExamples{
                    HelpExampleCli("getmemoryinfo", "")
            + HelpExampleRpc("getmemoryinfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::string mode = request.params[0].isNull() ? "stats" : request.params[0].get_str();
    if (mode == "stats") {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("locked", RPCLockedMemoryInfo());
        return obj;
    } else if (mode == "mallocinfo") {
#ifdef HAVE_MALLOC_INFO
        return RPCMallocInfo();
#else
        throw JSONRPCError(RPC_INVALID_PARAMETER, "mallocinfo mode not available");
#endif
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "unknown mode " + mode);
    }
},
    };
}